

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

ON_MeshNgon * __thiscall
ON_MeshNgonAllocator::AllocateNgon(ON_MeshNgonAllocator *this,uint Vcount,uint Fcount)

{
  void *pvVar1;
  size_t sVar2;
  ON_MeshNgon *pOVar3;
  long *plVar4;
  uint *puVar5;
  void **ppvVar6;
  uint uVar7;
  size_t sStack_30;
  
  if (Vcount < 3) {
    return (ON_MeshNgon *)0x0;
  }
  uVar7 = Fcount + Vcount;
  if (uVar7 < 8) {
    sVar2 = ON_FixedSizePool::SizeofElement(&this->m_7);
    uVar7 = 7;
    if (sVar2 != 0x38) {
      sStack_30 = 0x38;
LAB_00538e76:
      ON_FixedSizePool::Create(&this->m_7,sStack_30,0,0);
    }
  }
  else {
    if (0xf < uVar7) {
      if (uVar7 < 0x20) {
        plVar4 = (long *)this->m_31;
        uVar7 = 0x1f;
        if (plVar4 == (long *)0x0) goto LAB_00538ee6;
        ppvVar6 = &this->m_31;
LAB_00538eda:
        *ppvVar6 = (void *)*plVar4;
      }
      else {
        if (uVar7 < 0x40) {
          plVar4 = (long *)this->m_63;
          uVar7 = 0x3f;
          if (plVar4 != (long *)0x0) {
            ppvVar6 = &this->m_63;
            goto LAB_00538eda;
          }
        }
        else {
          uVar7 = uVar7 | 7;
        }
LAB_00538ee6:
        plVar4 = (long *)onmalloc((ulong)(uVar7 + 1) * 4 + 0x28);
        if (plVar4 == (long *)0x0) {
          return (ON_MeshNgon *)0x0;
        }
      }
      pvVar1 = this->m_active;
      *plVar4 = (long)pvVar1;
      if (pvVar1 != (void *)0x0) {
        *(long **)((long)pvVar1 + 8) = plVar4;
      }
      pOVar3 = (ON_MeshNgon *)(plVar4 + 2);
      plVar4[1] = 0;
      this->m_active = plVar4;
      goto LAB_00538f20;
    }
    this = (ON_MeshNgonAllocator *)&this->m_15;
    sVar2 = ON_FixedSizePool::SizeofElement((ON_FixedSizePool *)this);
    uVar7 = 0xf;
    if (sVar2 != 0x58) {
      sStack_30 = 0x58;
      goto LAB_00538e76;
    }
  }
  pOVar3 = (ON_MeshNgon *)ON_FixedSizePool::AllocateElement(&this->m_7);
  if (pOVar3 == (ON_MeshNgon *)0x0) {
    return (ON_MeshNgon *)0x0;
  }
LAB_00538f20:
  pOVar3[1].m_Vcount = uVar7;
  puVar5 = (uint *)0x0;
  if (Fcount != 0) {
    puVar5 = &pOVar3[1].m_Fcount + Vcount;
  }
  pOVar3->m_vi = &pOVar3[1].m_Fcount;
  pOVar3->m_fi = puVar5;
  pOVar3->m_Vcount = Vcount;
  pOVar3->m_Fcount = Fcount;
  return pOVar3;
}

Assistant:

ON_MeshNgon* ON_MeshNgonAllocator::AllocateNgon(
  unsigned int Vcount,
  unsigned int Fcount
  )
{
  struct ON_MeshNgonLink* link;
  ON_MeshNgon* ngon;
  unsigned int* a;
  unsigned int capacity;

  if ( Vcount < 3  )
    return 0;

  capacity = Vcount+Fcount;
  if ( capacity <= 7 )
  {
    capacity = 7;
    if ( SizeofNgon(capacity) != m_7.SizeofElement() )
      m_7.Create(SizeofNgon(capacity),0,0);
    ngon = (ON_MeshNgon*)m_7.AllocateElement();
  }
  else if ( capacity <= 15 )
  {
    capacity = 15;
    if ( SizeofNgon(capacity) != m_15.SizeofElement() )
      m_15.Create(SizeofNgon(capacity),0,0);
    ngon = (ON_MeshNgon*)m_15.AllocateElement();
  }
  else 
  {
    for(;;)
    {
      link = 0;
      if ( capacity <= 31 )
      {
        capacity = 31;
        if ( 0 != m_31 )
        {
          link = (struct ON_MeshNgonLink*)m_31;
          m_31 = link->next;
          break;
        }
      }
      else if ( capacity <= 63 )
      {
        capacity = 63;
        if ( 0 != m_63 )
        {
          link = (struct ON_MeshNgonLink*)m_63;
          m_63 = link->next;
          break;
        }
      }
      else
      {
        // make capacity % 8 = 7
        unsigned int n = (capacity % 8);
        capacity += (7-n);
      }
      link = (struct ON_MeshNgonLink*)onmalloc(sizeof(*link) + SizeofNgon(capacity));
      break;
    }
    if ( 0 == link )
      return 0;
    ngon = (ON_MeshNgon*)(link+1);
    link->next = (struct ON_MeshNgonLink*)m_active;
    if ( link->next )
      link->next->prev = link;
    link->prev = 0;
    m_active = link;
  }

  if ( 0 != ngon )
  {
    a = (unsigned int*)(ngon+1);
    *a++ = capacity;
    ngon->m_vi = a;
    ngon->m_fi = (Fcount > 0) ? (ngon->m_vi + Vcount) : 0;
    ngon->m_Vcount = Vcount;
    ngon->m_Fcount = Fcount;
    //memset(a,0xFF,capacity*sizeof(a[0])); // almost always a waste of time - user must init
  }

  return ngon;
}